

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.cpp
# Opt level: O1

int __thiscall IntegerRandomGenerator::generate(IntegerRandomGenerator *this)

{
  double dVar1;
  pointer pdVar2;
  pointer piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  dVar7 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&mRng);
  pdVar2 = (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
  iVar4 = (int)uVar5;
  if (iVar4 != 0) {
    dVar7 = dVar7 + 0.0;
    uVar6 = 0;
    do {
      if (uVar5 <= uVar6) {
LAB_00107beb:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      dVar1 = pdVar2[uVar6];
      if (dVar7 < dVar1) {
        piVar3 = (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar6 < (ulong)((long)(this->mValues).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
          return piVar3[uVar6];
        }
        goto LAB_00107beb;
      }
      dVar7 = dVar7 - dVar1;
      uVar6 = uVar6 + 1;
    } while (iVar4 != (int)uVar6);
  }
  return -1;
}

Assistant:

int IntegerRandomGenerator::generate()
{
    std::uniform_real_distribution<double> unif(0,1);
    double random = unif(mRng);

    uint32_t distSize = static_cast<uint32_t>(mDist.size());
    for(uint32_t i = 0; i < distSize; i++)
    {
        if(random < mDist.at(i))
        {
            return mValues.at(i);
        }
        else
        {
            random -= mDist.at(i);
        }
    }

    return -1;
}